

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteSwitch<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
               (Vector *left,Vector *right,Vector *result,idx_t count,anon_class_8_1_6971b95b fun)

{
  VectorType VVar1;
  VectorType VVar2;
  idx_t in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  Vector *in_R8;
  anon_class_8_1_6971b95b unaff_retaddr;
  Vector *in_stack_00000008;
  anon_class_8_1_6971b95b in_stack_00000010;
  VectorType right_vector_type;
  VectorType left_vector_type;
  idx_t in_stack_000000c0;
  Vector *in_stack_000000c8;
  Vector *in_stack_000000d0;
  Vector *in_stack_000000d8;
  anon_class_8_1_6971b95b in_stack_000000e0;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  VVar2 = Vector::GetVectorType(in_RSI);
  if ((VVar1 == CONSTANT_VECTOR) && (VVar2 == CONSTANT_VECTOR)) {
    ExecuteConstant<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
              (in_stack_00000008,unaff_retaddr.result,in_R8,in_stack_00000010);
  }
  else if ((VVar1 == FLAT_VECTOR) && (VVar2 == CONSTANT_VECTOR)) {
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,true>
              (in_R8,in_RDI,in_RSI,in_RDX,unaff_retaddr);
  }
  else if ((VVar1 == CONSTANT_VECTOR) && (VVar2 == FLAT_VECTOR)) {
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,true,false>
              (in_R8,in_RDI,in_RSI,in_RDX,unaff_retaddr);
  }
  else if ((VVar1 == FLAT_VECTOR) && (VVar2 == FLAT_VECTOR)) {
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,false>
              (in_stack_00000008,unaff_retaddr.result,in_R8,(idx_t)in_RDI,in_stack_00000010);
  }
  else {
    ExecuteGeneric<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseXOROperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
              (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
               in_stack_000000e0);
  }
  return;
}

Assistant:

static void ExecuteSwitch(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto left_vector_type = left.GetVectorType();
		auto right_vector_type = right.GetVectorType();
		if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
			ExecuteConstant<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(left, right, result, fun);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (left_vector_type == VectorType::FLAT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, false, true>(left, right, result,
			                                                                                  count, fun);
		} else if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::FLAT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, true, false>(left, right, result,
			                                                                                  count, fun);
		} else if (left_vector_type == VectorType::FLAT_VECTOR && right_vector_type == VectorType::FLAT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, false, false>(left, right, result,
			                                                                                   count, fun);
#endif
		} else {
			ExecuteGeneric<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(left, right, result, count, fun);
		}
	}